

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sift.hpp
# Opt level: O2

vector<std::array<float,_128UL>,_std::allocator<std::array<float,_128UL>_>_> *
sift::read_train(void)

{
  vector<std::array<float,_128UL>,_std::allocator<std::array<float,_128UL>_>_> *in_RDI;
  string fn_images_train;
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"sift_base.fvecs",&local_31);
  read_vectors(in_RDI,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return in_RDI;
}

Assistant:

static std::vector<point_type> read_train() {
    std::string fn_images_train = "sift_base.fvecs";
    return read_vectors(fn_images_train);
  }